

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_log_unregister_callback(ma_log *pLog,ma_log_callback callback)

{
  ma_log_callback_proc in_RSI;
  ma_log *in_RDI;
  ma_uint32 jLog;
  ma_uint32 iLog;
  uint local_28;
  uint local_24;
  ma_result local_4;
  
  if (in_RDI == (ma_log *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    ma_log_lock(in_RDI);
    local_24 = 0;
    while (local_24 < in_RDI->callbackCount) {
      if (in_RDI->callbacks[local_24].onLog == in_RSI) {
        for (local_28 = local_24; local_28 < in_RDI->callbackCount - 1; local_28 = local_28 + 1) {
          in_RDI->callbacks[local_28].onLog = in_RDI->callbacks[local_28 + 1].onLog;
          in_RDI->callbacks[local_28].pUserData = in_RDI->callbacks[local_28 + 1].pUserData;
        }
        in_RDI->callbackCount = in_RDI->callbackCount - 1;
      }
      else {
        local_24 = local_24 + 1;
      }
    }
    ma_log_unlock(in_RDI);
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_log_unregister_callback(ma_log* pLog, ma_log_callback callback)
{
    if (pLog == NULL) {
        return MA_INVALID_ARGS;
    }

    ma_log_lock(pLog);
    {
        ma_uint32 iLog;
        for (iLog = 0; iLog < pLog->callbackCount; ) {
            if (pLog->callbacks[iLog].onLog == callback.onLog) {
                /* Found. Move everything down a slot. */
                ma_uint32 jLog;
                for (jLog = iLog; jLog < pLog->callbackCount-1; jLog += 1) {
                    pLog->callbacks[jLog] = pLog->callbacks[jLog + 1];
                }

                pLog->callbackCount -= 1;
            } else {
                /* Not found. */
                iLog += 1;
            }
        }
    }
    ma_log_unlock(pLog);

    return MA_SUCCESS;
}